

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall Saturation::SaturationAlgorithm::~SaturationAlgorithm(SaturationAlgorithm *this)

{
  Splitter *this_00;
  ConsequenceFinder *this_01;
  SymElOutput *pSVar1;
  SimplifyingGeneratingInference *pSVar2;
  ImmediateSimplificationEngine *pIVar3;
  ForwardSimplificationEngine *pFVar4;
  SimplificationEngine *pSVar5;
  BwSimplList *pBVar6;
  BackwardSimplificationEngine *pBVar7;
  LiteralSelector *pLVar8;
  SubscriptionObject *pSVar9;
  RefCounter *pRVar10;
  PartialRedundancyHandler *pPVar11;
  Ordering *pOVar12;
  RefCounter *pRVar13;
  PassiveClauseContainer *pPVar14;
  Clause **ppCVar15;
  IndexManager *pIVar16;
  RefCounter *pRVar17;
  ForwardSimplificationEngine *pFVar18;
  FwSimplList *pFVar19;
  SimplList *pSVar20;
  void **head;
  ulong uVar21;
  
  (this->super_MainLoop)._vptr_MainLoop = (_func_int **)&PTR__SaturationAlgorithm_00b6b7a8;
  s_instance = (SaturationAlgorithm *)0x0;
  this_00 = this->_splitter;
  if (this_00 != (Splitter *)0x0) {
    Splitter::~Splitter(this_00);
    operator_delete(this_00,0x1a8);
  }
  this_01 = this->_consFinder;
  if (this_01 != (ConsequenceFinder *)0x0) {
    ConsequenceFinder::~ConsequenceFinder(this_01);
    operator_delete(this_01,0xa0);
  }
  pSVar1 = this->_symEl;
  if (pSVar1 != (SymElOutput *)0x0) {
    ::Lib::DHMap<Kernel::Clause_*,_Kernel::Color,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&pSVar1->_symElColors);
    ::Lib::DHMap<Kernel::Clause_*,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&pSVar1->_symElRewrites);
    operator_delete(pSVar1,0x70);
  }
  (this->_active->super_RandomAccessClauseContainer)._salg = (SaturationAlgorithm *)0x0;
  (((this->_passive)._M_t.
    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
    ._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl)->
  super_RandomAccessClauseContainer)._salg = (SaturationAlgorithm *)0x0;
  pSVar2 = (this->_generator)._obj;
  if (pSVar2 != (SimplifyingGeneratingInference *)0x0) {
    (*(pSVar2->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  pIVar3 = (this->_immediateSimplifier)._obj;
  if (pIVar3 != (ImmediateSimplificationEngine *)0x0) {
    (*(pIVar3->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  pFVar19 = this->_fwSimplifiers;
  pFVar18 = (ForwardSimplificationEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
  while (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pFVar19,
        (FwSimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ != (FwSimplList *)0x0) {
    pFVar4 = ((FwSimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_head;
    ((FwSimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_head = pFVar18;
    this->_fwSimplifiers = ((FwSimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_tail;
    (*(pFVar4->super_InferenceEngine)._vptr_InferenceEngine[3])(pFVar4);
    (*(pFVar4->super_InferenceEngine)._vptr_InferenceEngine[1])(pFVar4);
    pFVar18 = (ForwardSimplificationEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    pFVar19 = this->_fwSimplifiers;
  }
  pSVar20 = this->_simplifiers;
  while (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pSVar20,
        (SimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ != (SimplList *)0x0) {
    pSVar5 = ((SimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_head;
    ((SimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_head =
         (SimplificationEngine *)pFVar18;
    this->_simplifiers = ((SimplList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_)->_tail;
    (*(pSVar5->super_InferenceEngine)._vptr_InferenceEngine[3])(pSVar5);
    (*(pSVar5->super_InferenceEngine)._vptr_InferenceEngine[1])(pSVar5);
    pFVar18 = (ForwardSimplificationEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    pSVar20 = this->_simplifiers;
  }
  pBVar6 = this->_bwSimplifiers;
  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pFVar18;
  while (pBVar6 != (BwSimplList *)0x0) {
    pBVar7 = pBVar6->_head;
    pBVar6->_head = (BackwardSimplificationEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pBVar6;
    this->_bwSimplifiers = pBVar6->_tail;
    (*(pBVar7->super_InferenceEngine)._vptr_InferenceEngine[3])(pBVar7);
    (*(pBVar7->super_InferenceEngine)._vptr_InferenceEngine[1])(pBVar7);
    pBVar6 = this->_bwSimplifiers;
  }
  if (this->_unprocessed != (UnprocessedClauseContainer *)0x0) {
    (*(this->_unprocessed->super_ClauseContainer)._vptr_ClauseContainer[1])();
  }
  if (this->_active != (ActiveClauseContainer *)0x0) {
    (*(this->_active->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
      [1])();
  }
  pLVar8 = (this->_sosLiteralSelector)._obj;
  if (pLVar8 != (LiteralSelector *)0x0) {
    (*pLVar8->_vptr_LiteralSelector[1])();
  }
  pSVar9 = (this->_activeContRemovalSData)._obj;
  if (((pSVar9 != (SubscriptionObject *)0x0) &&
      (pRVar10 = (this->_activeContRemovalSData)._refCnt, pRVar10 != (RefCounter *)0x0)) &&
     (pRVar10->_val = pRVar10->_val + -1, pRVar10->_val == 0)) {
    ::Lib::SubscriptionObject::~SubscriptionObject(pSVar9);
    operator_delete(pSVar9,0x10);
    pRVar10 = (this->_activeContRemovalSData)._refCnt;
    if (pRVar10 != (RefCounter *)0x0) {
      *(undefined8 *)pRVar10 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar10;
    }
  }
  pSVar9 = (this->_passiveContRemovalSData)._obj;
  if (((pSVar9 != (SubscriptionObject *)0x0) &&
      (pRVar10 = (this->_passiveContRemovalSData)._refCnt, pRVar10 != (RefCounter *)0x0)) &&
     (pRVar10->_val = pRVar10->_val + -1, pRVar10->_val == 0)) {
    ::Lib::SubscriptionObject::~SubscriptionObject(pSVar9);
    operator_delete(pSVar9,0x10);
    pRVar10 = (this->_passiveContRemovalSData)._refCnt;
    if (pRVar10 != (RefCounter *)0x0) {
      *(undefined8 *)pRVar10 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar10;
    }
  }
  pPVar11 = (this->_partialRedundancyHandler)._M_t.
            super___uniq_ptr_impl<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Shell::PartialRedundancyHandler_*,_std::default_delete<Shell::PartialRedundancyHandler>_>
            .super__Head_base<0UL,_Shell::PartialRedundancyHandler_*,_false>._M_head_impl;
  if (pPVar11 != (PartialRedundancyHandler *)0x0) {
    (*pPVar11->_vptr_PartialRedundancyHandler[1])();
  }
  (this->_partialRedundancyHandler)._M_t.
  super___uniq_ptr_impl<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_Shell::PartialRedundancyHandler_*,_std::default_delete<Shell::PartialRedundancyHandler>_>
  .super__Head_base<0UL,_Shell::PartialRedundancyHandler_*,_false>._M_head_impl =
       (PartialRedundancyHandler *)0x0;
  pLVar8 = (this->_selector)._obj;
  if (pLVar8 != (LiteralSelector *)0x0) {
    (*pLVar8->_vptr_LiteralSelector[1])();
  }
  pOVar12 = (this->_ordering)._obj;
  if (((pOVar12 != (Ordering *)0x0) &&
      (pRVar13 = (this->_ordering)._refCnt, pRVar13 != (RefCounter *)0x0)) &&
     (pRVar13->_val = pRVar13->_val + -1, pRVar13->_val == 0)) {
    (*pOVar12->_vptr_Ordering[1])();
    pRVar13 = (this->_ordering)._refCnt;
    if (pRVar13 != (RefCounter *)0x0) {
      *(undefined8 *)pRVar13 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar13;
    }
  }
  pIVar3 = (this->_immediateSimplifier)._obj;
  if (pIVar3 != (ImmediateSimplificationEngine *)0x0) {
    (*(pIVar3->super_InferenceEngine)._vptr_InferenceEngine[1])();
  }
  pSVar2 = (this->_generator)._obj;
  if (pSVar2 != (SimplifyingGeneratingInference *)0x0) {
    (*(pSVar2->super_InferenceEngine)._vptr_InferenceEngine[1])();
  }
  pPVar14 = (this->_passive)._M_t.
            super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
            ._M_t.
            super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
            .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
  if (pPVar14 != (PassiveClauseContainer *)0x0) {
    (**(code **)(*(long *)&(pPVar14->super_RandomAccessClauseContainer).super_ClauseContainer + 8))
              ();
  }
  (this->_passive)._M_t.
  super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
  .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
       (PassiveClauseContainer *)0x0;
  ppCVar15 = (this->_postponedClauseRemovals)._stack;
  if (ppCVar15 != (Clause **)0x0) {
    uVar21 = (this->_postponedClauseRemovals)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar21 == 0) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar15;
    }
    else if (uVar21 < 0x11) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar15;
    }
    else if (uVar21 < 0x19) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar15;
    }
    else if (uVar21 < 0x21) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar15;
    }
    else if (uVar21 < 0x31) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar15;
    }
    else if (uVar21 < 0x41) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar15;
    }
    else {
      operator_delete(ppCVar15,0x10);
    }
  }
  ppCVar15 = (this->_newClauses)._s._stack;
  if (ppCVar15 != (Clause **)0x0) {
    uVar21 = (this->_newClauses)._s._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar21 == 0) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar15;
    }
    else if (uVar21 < 0x11) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar15;
    }
    else if (uVar21 < 0x19) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar15;
    }
    else if (uVar21 < 0x21) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar15;
    }
    else if (uVar21 < 0x31) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar15;
    }
    else if (uVar21 < 0x41) {
      *ppCVar15 = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar15;
    }
    else {
      operator_delete(ppCVar15,0x10);
    }
  }
  pIVar16 = (this->_imgr)._obj;
  if (((pIVar16 != (IndexManager *)0x0) &&
      (pRVar17 = (this->_imgr)._refCnt, pRVar17 != (RefCounter *)0x0)) &&
     (pRVar17->_val = pRVar17->_val + -1, pRVar17->_val == 0)) {
    ::Lib::
    DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>::
    ~DHMap(&pIVar16->_store);
    operator_delete(pIVar16,0x38);
    pRVar17 = (this->_imgr)._refCnt;
    if (pRVar17 != (RefCounter *)0x0) {
      *(undefined8 *)pRVar17 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar17;
    }
  }
  return;
}

Assistant:

SaturationAlgorithm::~SaturationAlgorithm()
{
  ASS_EQ(s_instance,this);

  s_instance = 0;

  if (_splitter) {
    delete _splitter;
  }
  if (_consFinder) {
    delete _consFinder;
  }
  if (_symEl) {
    delete _symEl;
  }

  _active->detach();
  _passive->detach();

  if (_generator) {
    _generator->detach();
  }
  if (_immediateSimplifier) {
    _immediateSimplifier->detach();
  }

  while (_fwSimplifiers) {
    ForwardSimplificationEngine* fse = FwSimplList::pop(_fwSimplifiers);
    fse->detach();
    delete fse;
  }
  while (_simplifiers) {
    SimplificationEngine* fse = SimplList::pop(_simplifiers);
    fse->detach();
    delete fse;
  }
  while (_bwSimplifiers) {
    BackwardSimplificationEngine* bse = BwSimplList::pop(_bwSimplifiers);
    bse->detach();
    delete bse;
  }

  delete _unprocessed;
  delete _active;
}